

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.hpp
# Opt level: O3

void __thiscall Flag::Flag<char_const*,char_const*>(Flag *this,char *identifier,char *identifier_1)

{
  long lVar1;
  long *plVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [16];
  long local_28 [2];
  
  (this->super_Switch)._vptr_Switch = (_func_int **)&PTR_identifiers_abi_cxx11__0010d9e0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,identifier,&local_59);
  std::__cxx11::string::string<std::allocator<char>>(local_38,identifier_1,&local_5a);
  __l._M_len = 2;
  __l._M_array = &local_58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ids,__l,&local_5b);
  lVar1 = -0x40;
  plVar2 = local_28;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  return;
}

Assistant:

explicit Flag(const T ...identifier) : ids { identifier... } {
        static_assert(sizeof...(T) >= 1, "At least one identifier must be provided");
    }